

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Column.cpp
# Opt level: O2

string * __thiscall
SQLite::Column::getString_abi_cxx11_(string *__return_storage_ptr__,Column *this)

{
  int iVar1;
  void *pvVar2;
  
  sqlite3_column_bytes
            ((this->mStmtPtr).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             this->mIndex);
  pvVar2 = sqlite3_column_blob((this->mStmtPtr).
                               super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               this->mIndex);
  iVar1 = sqlite3_column_bytes
                    ((this->mStmtPtr).super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,this->mIndex);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pvVar2,(long)iVar1 + (long)pvVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Column::getString() const
{
    // Note: using sqlite3_column_blob and not sqlite3_column_text
    // - no need for sqlite3_column_text to add a \0 on the end, as we're getting the bytes length directly
    //   however, we need to call sqlite3_column_bytes() to ensure correct format. It's a noop on a BLOB
    //   or a TEXT value with the correct encoding (UTF-8). Otherwise it'll do a conversion to TEXT (UTF-8).
    (void)sqlite3_column_bytes(mStmtPtr.get(), mIndex);
    auto data = static_cast<const char *>(sqlite3_column_blob(mStmtPtr.get(), mIndex));

    // SQLite docs: "The safest policy is to invoke… sqlite3_column_blob() followed by sqlite3_column_bytes()"
    // Note: std::string is ok to pass nullptr as first arg, if length is 0
    return std::string(data, sqlite3_column_bytes(mStmtPtr.get(), mIndex));
}